

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uart_ow.c
# Opt level: O1

uint8_t mraa_uart_ow_crc8(uint8_t *buffer,uint16_t length)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  byte bVar4;
  undefined2 in_register_00000032;
  char cVar5;
  byte bVar6;
  
  if (CONCAT22(in_register_00000032,length) != 0) {
    uVar3 = 0;
    bVar2 = 0;
    do {
      bVar4 = buffer[uVar3];
      cVar5 = -8;
      do {
        bVar6 = bVar2 ^ bVar4;
        bVar1 = bVar2 >> 1;
        bVar2 = bVar1 ^ 0x8c;
        if ((bVar6 & 1) == 0) {
          bVar2 = bVar1;
        }
        bVar4 = bVar4 >> 1;
        cVar5 = cVar5 + '\x01';
      } while (cVar5 != '\0');
      uVar3 = uVar3 + 1;
    } while (uVar3 != length);
    return bVar2;
  }
  return '\0';
}

Assistant:

uint8_t
mraa_uart_ow_crc8(uint8_t* buffer, uint16_t length)
{
    // 0x18 = X ^ 8 + X ^ 5 + X ^ 4 + X ^ 0
    static const uint8_t CRC8POLY = 0x18;

    uint8_t crc = 0x00;
    uint16_t loop_count;
    uint8_t bit_counter;
    uint8_t data;
    uint8_t feedback_bit;

    for (loop_count = 0; loop_count != length; loop_count++) {
        data = buffer[loop_count];
        bit_counter = 8;
        do {
            feedback_bit = (crc ^ data) & 0x01;
            if (feedback_bit == 0x01)
                crc = crc ^ CRC8POLY;
            crc = (crc >> 1) & 0x7F;
            if (feedback_bit == 0x01)
                crc = crc | 0x80;
            data = data >> 1;
            bit_counter--;
        } while (bit_counter > 0);
    }

    return crc;
}